

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O2

RSA * RSA_parse_public_key(CBS *cbs)

{
  int line;
  int iVar1;
  RSA *r;
  CBS child;
  
  r = (RSA *)RSA_new();
  if (r != (RSA *)0x0) {
    iVar1 = CBS_get_asn1(cbs,&child,0x20000010);
    if ((((iVar1 == 0) || (iVar1 = parse_integer(&child,&r->n), iVar1 == 0)) ||
        (iVar1 = parse_integer(&child,&r->e), iVar1 == 0)) || (child.len != 0)) {
      iVar1 = 100;
      line = 0x3b;
    }
    else {
      iVar1 = RSA_check_key((RSA *)r);
      if (iVar1 != 0) {
        return r;
      }
      iVar1 = 0x68;
      line = 0x41;
    }
    ERR_put_error(4,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                  ,line);
    RSA_free((RSA *)r);
  }
  return (RSA *)0x0;
}

Assistant:

RSA *RSA_parse_public_key(CBS *cbs) {
  RSA *ret = RSA_new();
  if (ret == NULL) {
    return NULL;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->n) ||
      !parse_integer(&child, &ret->e) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    RSA_free(ret);
    return NULL;
  }

  if (!RSA_check_key(ret)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_RSA_PARAMETERS);
    RSA_free(ret);
    return NULL;
  }

  return ret;
}